

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfers.c
# Opt level: O3

void read_transfer(transfer_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  transfer_type_t tVar2;
  ulong uVar3;
  char *pcVar4;
  transfer_t *__dest;
  ulong uVar5;
  
  record->from_stop_id[0] = '\0';
  record->to_stop_id[0] = '\0';
  record->transfer_type = TT_RECOMMENDED;
  record->min_transfer_time = 0;
  if (0 < field_count) {
    uVar5 = 0;
    do {
      pcVar4 = field_names[uVar5];
      iVar1 = strcmp(pcVar4,"from_stop_id");
      if (iVar1 == 0) {
        pcVar4 = field_values[uVar5];
        __dest = record;
LAB_00107577:
        strcpy(__dest->from_stop_id,pcVar4);
      }
      else {
        iVar1 = strcmp(pcVar4,"to_stop_id");
        if (iVar1 == 0) {
          pcVar4 = field_values[uVar5];
          __dest = (transfer_t *)record->to_stop_id;
          goto LAB_00107577;
        }
        iVar1 = strcmp(pcVar4,"transfer_type");
        if (iVar1 == 0) {
          tVar2 = parse_transfer_type(field_values[uVar5]);
          record->transfer_type = tVar2;
        }
        else {
          iVar1 = strcmp(pcVar4,"min_transfer_time");
          if (iVar1 == 0) {
            uVar3 = strtoul(field_values[uVar5],(char **)0x0,0);
            record->min_transfer_time = (uint)uVar3;
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while ((uint)field_count != uVar5);
  }
  return;
}

Assistant:

void read_transfer(transfer_t *record, int field_count, const char **field_names, const char **field_values) {
    init_transfer(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "from_stop_id") == 0) {
            strcpy(record->from_stop_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "to_stop_id") == 0) {
            strcpy(record->to_stop_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "transfer_type") == 0) {
            record->transfer_type = parse_transfer_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "min_transfer_time") == 0) {
            record->min_transfer_time = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
    }
}